

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O1

void * reader_worker(void *param)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  
  uVar3 = 0;
  do {
    if (*(int *)((long)param + 0x60) != 0 || uVar3 != 0) {
      return (void *)0x0;
    }
    puVar1 = (uint *)(**(code **)((long)param + 0x38))(param);
    if (puVar1 != (uint *)0x0) {
      if (param == (void *)0x0) {
        _mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"impl","add_new_slot",0x56);
        if ((DAT_001102d3 & 0x10) != 0) goto LAB_00106931;
      }
      uVar3 = *(uint *)((long)param + 0x68);
      *puVar1 = uVar3;
      *(uint **)(*(long *)((long)param + 0x70) + (ulong)uVar3 * 8) = puVar1;
      *(uint *)((long)param + 0x68) = uVar3 + 1;
      if (uVar3 + 1 < *(uint *)((long)param + 100)) {
LAB_001068a5:
        if (*(long *)((long)param + 0x70) == 0) {
          _mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"impl->slots",
                     "add_new_slot",100);
          if ((DAT_001102d3 & 0x10) != 0) goto LAB_00106931;
        }
        if (*(uint *)((long)param + 100) <= *(uint *)((long)param + 0x68)) {
          _mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,
                     "impl->slot_cnt < impl->slot_max","add_new_slot",0x65);
          if ((DAT_001102d3 & 0x10) != 0) {
LAB_00106931:
            abort();
          }
        }
      }
      else {
        lVar2 = mpp_osal_realloc("add_new_slot",*(undefined8 *)((long)param + 0x70),
                                 (ulong)(*(uint *)((long)param + 100) * 2) << 3);
        *(long *)((long)param + 0x70) = lVar2;
        if (lVar2 != 0) {
          *(int *)((long)param + 100) = *(int *)((long)param + 100) << 1;
          goto LAB_001068a5;
        }
      }
      uVar3 = puVar1[6];
    }
    if (puVar1 == (uint *)0x0) {
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

static void* reader_worker(void *param)
{
    FileReaderImpl *impl = (FileReaderImpl*)param;
    RK_U32 eos = 0;

    while (!impl->thd_stop && !eos) {
        FileBufSlot *slot = impl->read_func(impl);

        if (NULL == slot)
            break;

        add_new_slot(impl, slot);
        eos = slot->eos;
    }

    return NULL;
}